

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.h
# Opt level: O1

int __thiscall google::protobuf::UnknownFieldSet::SpaceUsedExcludingSelf(UnknownFieldSet *this)

{
  size_t sVar1;
  LogMessage *other;
  LogMessage local_58;
  LogFinisher local_19;
  
  sVar1 = SpaceUsedExcludingSelfLong(this);
  if ((sVar1 & 0xffffffff80000000) != 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/message_lite.h"
               ,0x6b);
    other = internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: (size) <= (static_cast<size_t>(2147483647)): ");
    internal::LogFinisher::operator=(&local_19,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  return (int)sVar1;
}

Assistant:

int SpaceUsedExcludingSelf() const {
    return internal::ToIntSize(SpaceUsedExcludingSelfLong());
  }